

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.h
# Opt level: O0

shared_ptr<cppcms::application_specific_pool> cppcms::create_pool<unit_test>(void)

{
  simple_application_specific_pool1<unit_test,_std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  simple_application_specific_pool1<unit_test,_std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  *in_RDI;
  shared_ptr<cppcms::application_specific_pool> sVar1;
  type functor;
  shared_ptr<cppcms::application_specific_pool> *f;
  simple_application_specific_pool1<unit_test,_std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  *this_00;
  _Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)> *call;
  _Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)> local_18;
  
  call = &local_18;
  this_00 = in_RDI;
  std::bind<unit_test*(*)(cppcms::service&),std::_Placeholder<1>const&>
            (&call->_M_f,(_Placeholder<1> *)in_RDI);
  this = (simple_application_specific_pool1<unit_test,_std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
          *)operator_new(0x30);
  std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>::_Bind
            ((_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)> *)this_00,
             (_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)> *)in_RDI);
  details::
  simple_application_specific_pool1<unit_test,_std::_Bind<unit_test_*(*(std::_Placeholder<1>))(cppcms::service_&)>_>
  ::simple_application_specific_pool1(this,call);
  std::shared_ptr<cppcms::application_specific_pool>::
  shared_ptr<cppcms::details::simple_application_specific_pool1<unit_test,std::_Bind<unit_test*(*(std::_Placeholder<1>))(cppcms::service&)>>,void>
            ((shared_ptr<cppcms::application_specific_pool> *)this_00,in_RDI);
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this_00->super_application_specific_pool;
  return (shared_ptr<cppcms::application_specific_pool>)
         sVar1.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

booster::shared_ptr<application_specific_pool> create_pool(P...p)
	{
        auto functor = std::bind(&details::create_app<T,P...>,std::placeholders::_1,p...);
        typedef details::simple_application_specific_pool1<T,decltype(functor)> pool_type;
		booster::shared_ptr<application_specific_pool> f(new pool_type(std::move(functor)));
		return f;
	}